

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void tge_setup2(tgestate_t *state)

{
  int iVar1;
  long lVar2;
  vischar_t *pvVar3;
  int carry;
  uint uVar4;
  uint uVar5;
  char cVar6;
  uint uVar7;
  
  lVar2 = 0x2c0;
  do {
    uVar4 = (int)lVar2 - 0x2c0;
    uVar7 = 0;
    cVar6 = -8;
    do {
      uVar5 = uVar4 & 1;
      uVar4 = uVar4 >> 1 & 0x7f;
      uVar7 = uVar5 + (uVar7 & 0xff) * 2;
      cVar6 = cVar6 + '\x01';
    } while (cVar6 != '\0');
    *(char *)((long)state->jmpbuf_main[0].__jmpbuf + lVar2 + -0x20) = (char)uVar7;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x3c0);
  pvVar3 = state->vischars;
  cVar6 = -8;
  do {
    *(undefined8 *)&(pvVar3->mi).sprite_index = 0;
    (pvVar3->isopos).x = 0;
    (pvVar3->isopos).y = 0;
    pvVar3->room = '\0';
    pvVar3->unused = '\0';
    pvVar3->width_bytes = '\0';
    pvVar3->height = '\0';
    *(undefined8 *)&pvVar3->mi = 0x1800000000;
    (pvVar3->mi).sprite = sprites + 2;
    pvVar3->anim = (anim_t *)"\x01";
    pvVar3->animindex = '\0';
    pvVar3->input = '\0';
    pvVar3->direction = '\0';
    *(undefined5 *)&pvVar3->field_0x1b = 0;
    pvVar3->character = '\0';
    pvVar3->flags = '\0';
    (pvVar3->route).index = ',';
    (pvVar3->route).step = '\x01';
    (pvVar3->target).u = '.';
    (pvVar3->target).v = '.';
    (pvVar3->target).w = '\x18';
    pvVar3->counter_and_flags = '\0';
    pvVar3->animbase = animations;
    pvVar3 = pvVar3 + 1;
    cVar6 = cVar6 + '\x01';
  } while (cVar6 != '\0');
  pvVar3 = state->vischars;
  cVar6 = -7;
  do {
    pvVar3 = pvVar3 + 1;
    pvVar3->character = 0xff;
    pvVar3->flags = 0xff;
    cVar6 = cVar6 + '\x01';
  } while (cVar6 != '\0');
  iVar1 = _setjmp((__jmp_buf_tag *)state->jmpbuf_main);
  if (iVar1 != 0) {
    return;
  }
  reset_game(state);
  iVar1 = _setjmp((__jmp_buf_tag *)state->jmpbuf_main);
  if (iVar1 == 0) {
    main_loop(state);
  }
  return;
}

Assistant:

TGE_API void tge_setup2(tgestate_t *state)
{
  /**
   * $F1C9: Initial state of a visible character.
   *
   * The original game stores just 23 bytes of the structure, we store a
   * whole structure here.
   *
   * This can't be a _static_ const structure as it contains references which
   * are not compile time constant.
   */
  const vischar_t vischar_initial =
  {
    0,                    // character
    0,                    // flags
    { 44, 1 },            // route
    { 46, 46, 24 },       // pos
    0,                    // counter_and_flags
    &animations[0],       // animbase
    (const anim_t *) anim_wait_tl,   //animations[8],        // anim
    0,                    // animindex
    0,                    // input
    direction_TOP_LEFT,   // direction
    { { 0, 0, 24 }, &sprites[sprite_PRISONER_FACING_AWAY_1], 0 }, // mi
    { 0, 0 },             // scrx, scry
    room_0_OUTDOORS,      // room
    0,                    // unused
    0,                    // width_bytes
    0,                    // height
  };

  uint8_t   *reversed; /* was HL */
  uint8_t    counter;  /* was A */
  uint8_t    byte;     /* was C */
  uint8_t    iters;    /* was B */
  int        carry = 0;
  vischar_t *vischar;  /* was HL */

  assert(state != NULL);

  /* Construct a table of 256 bit-reversed bytes in state->reversed[]. */
  reversed = &state->reversed[0];
  do
  {
    /* This was 'A = L;' in original code as alignment was guaranteed. */
    counter = reversed - &state->reversed[0]; /* Get a counter 0..255. */ // note: narrowing

    /* Reverse the counter byte. */
    byte = 0;
    iters = 8;
    do
    {
      carry = counter & 1;
      counter >>= 1;
      byte = (byte << 1) | carry;
    }
    while (--iters);

    *reversed++ = byte;
  }
  while (reversed != &state->reversed[256]); // was ((HL & 0xFF) != 0);

  /* Initialise all visible characters. */
  // FUTURE: Fold this to:
  // for (vischar = &state->vischars[0]; vischar < &state->vischars[vischars_LENGTH]; vischar++)
  //   *vischar = vischar_initial;
  vischar = &state->vischars[0];
  iters = vischars_LENGTH;
  do
  {
    memcpy(vischar, &vischar_initial, sizeof(vischar_initial));
    vischar++;
  }
  while (--iters);

  /* Write (character_NONE, vischar_FLAGS_EMPTY_SLOT) over all non-visible
   * characters. */
  iters = vischars_LENGTH - 1;
  vischar = &state->vischars[1];
  do
  {
    vischar->character = character_NONE;
    vischar->flags     = vischar_FLAGS_EMPTY_SLOT;
    vischar++;
  }
  while (--iters);

  // Conv: Set up a jmpbuf so the game will return here.
  if (setjmp(state->jmpbuf_main) == 0)
  {
    /* In the original code this wiped all state from $8100 up until the
     * start of tiles ($8218). We'll assume for now that tgestate_t is
     * calloc'd and so zeroed by default. */

    reset_game(state);

    // reset_game, which in turn calls enter_room which exits via longjmp to after this if statement block

    // i reckon this never gets this far, as reset_game jumps to enter_room itself
    //enter_room(state); // returns by goto main_loop
    NEVER_RETURNS;
  }
  // we arrive here once the game is initialised and the initial bedroom scene is drawn and zoomboxed onto the screen
}